

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

RPCHelpMan * wallet::listwalletdir(void)

{
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff8c8;
  RPCResult *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff8d0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff900;
  allocator<char> *in_stack_fffffffffffff908;
  iterator in_stack_fffffffffffff910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff918;
  undefined1 in_stack_fffffffffffff92f;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff930;
  string *in_stack_fffffffffffff938;
  RPCResult *in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff948;
  Type in_stack_fffffffffffff94c;
  RPCResult *in_stack_fffffffffffff950;
  undefined1 *local_6a0;
  undefined1 *local_688;
  undefined1 *local_670;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  RPCHelpMan *name;
  RPCHelpMan *this_00;
  allocator<char> local_52f;
  allocator<char> local_52e;
  allocator<char> local_52d;
  allocator<char> local_52c [4];
  pointer local_528;
  pointer pRStack_520;
  pointer local_518;
  allocator<char> local_502;
  allocator<char> local_501 [31];
  allocator<char> local_4e2;
  allocator<char> local_4e1 [17];
  undefined8 in_stack_fffffffffffffb30;
  allocator<char> local_4c2;
  allocator<char> local_4c1 [31];
  undefined1 local_4a2;
  RPCResults local_4a1;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  vector<RPCArg,_std::allocator<RPCArg>_> local_46a [13];
  undefined1 local_328 [136];
  undefined1 local_2a0 [64];
  undefined1 local_260 [136];
  undefined1 local_1d8 [64];
  undefined1 local_198 [136];
  undefined1 local_110 [264];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (RPCHelpMan *)
            ((long)&local_46a[0].super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start + 1);
  name = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  args = local_46a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  local_488 = 0;
  uStack_480 = 0;
  local_478 = 0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff8c8);
  results = &local_4a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  examples = (RPCExamples *)&local_4a2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  local_528 = (pointer)0x0;
  pRStack_520 = (pointer)0x0;
  local_518 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff8c8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff950,in_stack_fffffffffffff94c,(string *)in_stack_fffffffffffff940
             ,in_stack_fffffffffffff938,in_stack_fffffffffffff930,(bool)in_stack_fffffffffffff92f);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff8c8);
  __l._M_len = (size_type)in_stack_fffffffffffff918;
  __l._M_array = in_stack_fffffffffffff910;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff908,__l,
             (allocator_type *)in_stack_fffffffffffff900);
  RPCResult::RPCResult
            (in_stack_fffffffffffff950,in_stack_fffffffffffff94c,(string *)in_stack_fffffffffffff940
             ,in_stack_fffffffffffff938,in_stack_fffffffffffff930,(bool)in_stack_fffffffffffff92f);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff8c8);
  __l_00._M_len = (size_type)in_stack_fffffffffffff918;
  __l_00._M_array = in_stack_fffffffffffff910;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff908,__l_00,
             (allocator_type *)in_stack_fffffffffffff900);
  RPCResult::RPCResult
            (in_stack_fffffffffffff950,in_stack_fffffffffffff94c,(string *)in_stack_fffffffffffff940
             ,in_stack_fffffffffffff938,in_stack_fffffffffffff930,(bool)in_stack_fffffffffffff92f);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff8c8);
  __l_01._M_len = (size_type)in_stack_fffffffffffff918;
  __l_01._M_array = in_stack_fffffffffffff910;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff908,__l_01,
             (allocator_type *)in_stack_fffffffffffff900);
  RPCResult::RPCResult
            (in_stack_fffffffffffff950,in_stack_fffffffffffff94c,(string *)in_stack_fffffffffffff940
             ,in_stack_fffffffffffff938,in_stack_fffffffffffff930,(bool)in_stack_fffffffffffff92f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             in_stack_fffffffffffff940);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  HelpExampleCli(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  HelpExampleRpc(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  std::operator+(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff8c8,(string *)0x9dfe4a);
  this = (RPCResult *)&stack0xfffffffffffffab0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::listwalletdir()::__0,void>(in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
  RPCHelpMan::RPCHelpMan
            (this_00,&name->m_name,&in_RDI->m_name,args,results,examples,
             (RPCMethodImpl *)in_stack_fffffffffffffb30);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_52f);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_52e);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_52d);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_52c);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult(this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff8d8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_670 = local_110;
  do {
    local_670 = local_670 + -0x88;
    RPCResult::~RPCResult(this);
  } while (local_670 != local_198);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff8d8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_688 = local_1d8;
  do {
    local_688 = local_688 + -0x88;
    RPCResult::~RPCResult(this);
  } while (local_688 != local_260);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff8d8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_6a0 = local_2a0;
  do {
    local_6a0 = local_6a0 + -0x88;
    RPCResult::~RPCResult(this);
  } while (local_6a0 != local_328);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff8d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_502);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_501);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_4e2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_4e1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_4c2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_4c1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff8d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_46a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&local_46a[0].super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                     super__Vector_impl_data._M_start + 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return name;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan listwalletdir()
{
    return RPCHelpMan{"listwalletdir",
                "Returns a list of wallets in the wallet directory.\n",
                {},
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::ARR, "wallets", "",
                        {
                            {RPCResult::Type::OBJ, "", "",
                            {
                                {RPCResult::Type::STR, "name", "The wallet name"},
                            }},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("listwalletdir", "")
            + HelpExampleRpc("listwalletdir", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    UniValue wallets(UniValue::VARR);
    for (const auto& [path, _] : ListDatabases(GetWalletDir())) {
        UniValue wallet(UniValue::VOBJ);
        wallet.pushKV("name", path.utf8string());
        wallets.push_back(std::move(wallet));
    }

    UniValue result(UniValue::VOBJ);
    result.pushKV("wallets", std::move(wallets));
    return result;
},
    };
}